

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,UnknownField *other)

{
  Type TVar1;
  string *this_00;
  UnknownFieldSet *pUVar2;
  UnknownField *in_RDI;
  UnknownFieldSet *group;
  undefined4 in_stack_ffffffffffffffd0;
  
  TVar1 = type(in_RDI);
  if (TVar1 == TYPE_LENGTH_DELIMITED) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00,(string *)(in_RDI->data_).group_);
    (in_RDI->data_).group_ = (UnknownFieldSet *)this_00;
  }
  else if (TVar1 == TYPE_GROUP) {
    pUVar2 = (UnknownFieldSet *)operator_new(0x18);
    UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)0x471ff0);
    UnknownFieldSet::InternalMergeFrom
              ((UnknownFieldSet *)CONCAT44(TVar1,in_stack_ffffffffffffffd0),
               (UnknownFieldSet *)in_RDI);
    (in_RDI->data_).group_ = pUVar2;
  }
  return;
}

Assistant:

void UnknownField::DeepCopy(const UnknownField& other) {
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      data_.length_delimited_.string_value =
          new std::string(*data_.length_delimited_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = new UnknownFieldSet();
      group->InternalMergeFrom(*data_.group_);
      data_.group_ = group;
      break;
    }
    default:
      break;
  }
}